

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_cpio_odc.c
# Opt level: O0

int format_octal(int64_t v,char *p,int s)

{
  int local_28;
  int local_24;
  int len;
  int s_local;
  char *p_local;
  int64_t v_local;
  
  local_28 = s;
  _len = p;
  if (v < 0) {
    while (0 < local_28) {
      *_len = '0';
      local_28 = local_28 + -1;
      _len = _len + 1;
    }
    v_local._4_4_ = -1;
  }
  else {
    local_24 = s;
    _len = p + s;
    p_local = (char *)v;
    while (0 < local_24) {
      _len[-1] = ((byte)p_local & 7) + 0x30;
      p_local = (char *)((long)p_local >> 3);
      local_24 = local_24 + -1;
      _len = _len + -1;
    }
    if (p_local == (char *)0x0) {
      v_local._4_4_ = 0;
    }
    else {
      while (0 < local_28) {
        *_len = '7';
        local_28 = local_28 + -1;
        _len = _len + 1;
      }
      v_local._4_4_ = -1;
    }
  }
  return v_local._4_4_;
}

Assistant:

static int
format_octal(int64_t v, void *p, int digits)
{
	int64_t	max;
	int	ret;

	max = (((int64_t)1) << (digits * 3)) - 1;
	if (v >= 0  &&  v <= max) {
	    format_octal_recursive(v, (char *)p, digits);
	    ret = 0;
	} else {
	    format_octal_recursive(max, (char *)p, digits);
	    ret = -1;
	}
	return (ret);
}